

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# queue_generic_tests.h
# Opt level: O3

void density_tests::detail::
     PutUInt16<density::conc_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<256UL>_>_>
     ::consume(consume_operation *i_consume)

{
  runtime_type<> *prVar1;
  unsigned_short *puVar2;
  
  prVar1 = density::
           heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<256UL>_>::
           consume_operation::complete_type((consume_operation *)&i_consume->m_consume_operation);
  if (prVar1->m_feature_table !=
      (tuple_type *)
      density::detail::
      FeatureTable<std::tuple<density::f_size,density::f_alignment,density::f_copy_construct,density::f_move_construct,density::f_rtti,density::f_destroy>,unsigned_short>
      ::s_table) {
    assert_failed<>("i_consume.complete_type().template is<ElementType>()",
                    "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/tests/generic_tests/queue_generic_tests.h"
                    ,0xbc);
  }
  puVar2 = density::
           heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<256UL>_>::
           consume_operation::element<unsigned_short>
                     ((consume_operation *)&i_consume->m_consume_operation);
  if (*puVar2 == 0x10) {
    return;
  }
  assert_failed<>("i_consume.template element<ElementType>() == 16",
                  "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/tests/generic_tests/queue_generic_tests.h"
                  ,0xbd);
  return;
}

Assistant:

static void consume(const typename QUEUE::consume_operation & i_consume)
            {
                DENSITY_TEST_ASSERT(i_consume.complete_type().template is<ElementType>());
                DENSITY_TEST_ASSERT(i_consume.template element<ElementType>() == 16);
            }